

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

void __thiscall spvtools::opt::InlinePass::InitializeInline(InlinePass *this)

{
  reference this_00;
  bool bVar1;
  IRContext *this_01;
  StructuredCFGAnalysis *this_02;
  Module *this_03;
  reference this_04;
  mapped_type *ppFVar2;
  reference this_05;
  mapped_type *ppBVar3;
  uint32_t local_b8;
  uint32_t local_b4;
  reference local_b0;
  value_type *blk;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  reference local_78;
  value_type *fn;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  InlinePass *local_10;
  InlinePass *this_local;
  
  this->false_id_ = 0;
  local_10 = this;
  std::
  unordered_map<unsigned_int,_spvtools::opt::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>_>
  ::clear(&this->id2function_);
  std::
  unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
  ::clear(&this->id2block_);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear
            (&this->inlinable_);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear
            (&this->no_return_in_loop_);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear
            (&this->early_return_funcs_);
  this_01 = Pass::context(&this->super_Pass);
  this_02 = IRContext::GetStructuredCFGAnalysis(this_01);
  StructuredCFGAnalysis::FindFuncsCalledFromContinue
            ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&__range2,this_02);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::operator=(&this->funcs_called_from_continue_,
              (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&__range2);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&__range2);
  this_03 = Pass::get_module(&this->super_Pass);
  join_0x00000010_0x00000000_ = Module::begin(this_03);
  _fn = Module::end(this_03);
  while (bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                           ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                            (UptrVectorIterator<spvtools::opt::Function,_false> *)&fn), bVar1) {
    this_04 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    local_78 = this_04;
    __range3._4_4_ = Function::result_id(this_04);
    ppFVar2 = std::
              unordered_map<unsigned_int,_spvtools::opt::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>_>
              ::operator[](&this->id2function_,(key_type *)((long)&__range3 + 4));
    this_00 = local_78;
    *ppFVar2 = this_04;
    join_0x00000010_0x00000000_ = Function::begin(local_78);
    _blk = Function::end(this_00);
    while (bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                              &__end3.iterator_,
                              (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&blk), bVar1)
    {
      this_05 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                          ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_
                          );
      local_b0 = this_05;
      local_b4 = BasicBlock::id(this_05);
      ppBVar3 = std::
                unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
                ::operator[](&this->id2block_,&local_b4);
      *ppBVar3 = this_05;
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end3.iterator_);
    }
    bVar1 = IsInlinableFunction(this,local_78);
    if (bVar1) {
      local_b8 = Function::result_id(local_78);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                (&this->inlinable_,&local_b8);
    }
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  return;
}

Assistant:

void InlinePass::InitializeInline() {
  false_id_ = 0;

  // clear collections
  id2function_.clear();
  id2block_.clear();
  inlinable_.clear();
  no_return_in_loop_.clear();
  early_return_funcs_.clear();
  funcs_called_from_continue_ =
      context()->GetStructuredCFGAnalysis()->FindFuncsCalledFromContinue();

  for (auto& fn : *get_module()) {
    // Initialize function and block maps.
    id2function_[fn.result_id()] = &fn;
    for (auto& blk : fn) {
      id2block_[blk.id()] = &blk;
    }
    // Compute inlinability
    if (IsInlinableFunction(&fn)) inlinable_.insert(fn.result_id());
  }
}